

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O3

ssize_t __thiscall
cmdline::parser::
option_with_value_with_reader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::default_reader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::read(option_with_value_with_reader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::default_reader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *this,int __fd,void *__buf,size_t __nbytes)

{
  (this->
  super_option_with_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ).super_option_base._vptr_option_base =
       (_func_int **)
       &(this->
        super_option_with_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ).nam._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,*__buf,*(long *)((long)__buf + 8) + *__buf);
  return (ssize_t)this;
}

Assistant:

T read(const std::string& s) {
            return reader(s);
        }